

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O0

EVP_MD * EVP_get_digestbyname(char *name)

{
  char *__s1;
  int iVar1;
  EVP_MD *pEVar2;
  char *long_name;
  char *short_name;
  uint i;
  char *name_local;
  
  short_name._4_4_ = 0;
  while( true ) {
    if (0x11 < short_name._4_4_) {
      return (EVP_MD *)0x0;
    }
    __s1 = nid_to_digest_mapping[short_name._4_4_].long_name;
    if (((nid_to_digest_mapping[short_name._4_4_].short_name != (char *)0x0) &&
        (iVar1 = strcmp(nid_to_digest_mapping[short_name._4_4_].short_name,name), iVar1 == 0)) ||
       ((__s1 != (char *)0x0 && (iVar1 = strcmp(__s1,name), iVar1 == 0)))) break;
    short_name._4_4_ = short_name._4_4_ + 1;
  }
  pEVar2 = (EVP_MD *)(*nid_to_digest_mapping[short_name._4_4_].md_func)();
  return pEVar2;
}

Assistant:

const EVP_MD *EVP_get_digestbyname(const char *name) {
  for (unsigned i = 0; i < OPENSSL_ARRAY_SIZE(nid_to_digest_mapping); i++) {
    const char *short_name = nid_to_digest_mapping[i].short_name;
    const char *long_name = nid_to_digest_mapping[i].long_name;
    if ((short_name && strcmp(short_name, name) == 0) ||
        (long_name && strcmp(long_name, name) == 0)) {
      return nid_to_digest_mapping[i].md_func();
    }
  }

  return NULL;
}